

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

int main(void)

{
  uint uVar1;
  Executor *this;
  undefined1 *__stat_loc;
  Task D;
  Task C;
  Task B;
  Task A;
  Executor executor;
  Taskflow taskflow;
  string *in_stack_fffffffffffffc28;
  tuple<tf::Task_&,_tf::Task_&,_tf::Task_&,_tf::Task_&> *in_stack_fffffffffffffc30;
  Taskflow *this_00;
  Task *in_stack_fffffffffffffc38;
  Executor *this_01;
  Task *in_stack_fffffffffffffc40;
  Task *this_02;
  string *in_stack_fffffffffffffc48;
  Taskflow *in_stack_fffffffffffffc50;
  anon_class_1_0_00000001 *cs_3;
  allocator<char> *in_stack_fffffffffffffc60;
  char *in_stack_fffffffffffffc68;
  anon_class_8_1_54a397e3 *cs_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_03;
  element_type *in_stack_fffffffffffffc78;
  allocator<char> local_361;
  string local_360 [39];
  allocator<char> local_339;
  string local_338 [39];
  undefined8 local_311;
  allocator<char> local_2e9;
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffffd18;
  size_t in_stack_fffffffffffffd20;
  Executor *in_stack_fffffffffffffd28;
  Task local_270;
  anon_class_1_0_00000001 local_268 [8];
  Task local_260;
  Task local_258;
  anon_class_8_1_54a397e3 local_250 [2];
  undefined1 local_240 [335];
  undefined1 local_f1 [237];
  int local_4;
  
  local_4 = 0;
  this_03 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_03,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
  tf::Taskflow::Taskflow(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  std::__cxx11::string::~string((string *)(local_f1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_f1);
  uVar1 = std::thread::hardware_concurrency();
  this = (Executor *)(ulong)uVar1;
  cs_1 = local_250;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28)
  ;
  tf::Executor::Executor
            (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x1048e8);
  tf::Task::Task(&local_258);
  tf::Task::Task(&local_260);
  cs_3 = local_268;
  tf::Task::Task((Task *)cs_3);
  tf::Task::Task(&local_270);
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_runtime_cpp:14:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_runtime_cpp:15:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_runtime_cpp:19:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_runtime_cpp:20:5),_nullptr>
            ((FlowBuilder *)in_stack_fffffffffffffc78,(anon_class_1_0_00000001 *)this_03,cs_1,
             (anon_class_1_0_00000001 *)this,cs_3);
  std::tie<tf::Task,tf::Task,tf::Task,tf::Task>
            ((Task *)in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
             (Task *)in_stack_fffffffffffffc30);
  std::tuple<tf::Task&,tf::Task&,tf::Task&,tf::Task&>::operator=
            (in_stack_fffffffffffffc30,
             (tuple<tf::Task,_tf::Task,_tf::Task,_tf::Task> *)in_stack_fffffffffffffc28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_03,(char *)cs_1,(allocator<char> *)this);
  tf::Task::name((Task *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd18);
  std::allocator<char>::~allocator(&local_2e9);
  this_02 = (Task *)&local_311;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_03,(char *)cs_1,(allocator<char> *)this);
  tf::Task::name((Task *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  std::__cxx11::string::~string((string *)((long)&local_311 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  this_01 = (Executor *)&local_339;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_03,(char *)cs_1,(allocator<char> *)this);
  tf::Task::name((Task *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator(&local_339);
  this_00 = (Taskflow *)&local_361;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_03,(char *)cs_1,(allocator<char> *)this);
  tf::Task::name((Task *)this_00,in_stack_fffffffffffffc28);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator(&local_361);
  tf::Task::precede<tf::Task&,tf::Task&,tf::Task&>
            (this_02,(Task *)this_01,(Task *)this_00,(Task *)in_stack_fffffffffffffc28);
  tf::Taskflow::dump(this_00,(ostream *)in_stack_fffffffffffffc28);
  __stat_loc = local_240;
  tf::Executor::run(this_01,this_00);
  std::__basic_future<void>::wait((__basic_future<void> *)&stack0xfffffffffffffc78,__stat_loc);
  tf::Future<void>::~Future((Future<void> *)this_00);
  local_4 = 0;
  tf::Executor::~Executor(this);
  tf::Taskflow::~Taskflow(this_00);
  return local_4;
}

Assistant:

int main() {

  tf::Taskflow taskflow("Runtime Tasking");
  tf::Executor executor;

  tf::Task A, B, C, D;

  std::tie(A, B, C, D) = taskflow.emplace(
    [] () { return 0; },
    [&C] (tf::Runtime& rt) {  // C must be captured by reference
      std::cout << "B\n";
      rt.schedule(C);
    },
    [] () { std::cout << "C\n"; },
    [] () { std::cout << "D\n"; }
  );

  // name tasks
  A.name("A");
  B.name("B");
  C.name("C");
  D.name("D");

  // create conditional dependencies
  A.precede(B, C, D);

  // dump the graph structure
  taskflow.dump(std::cout);

  // we will see both B and C in the output
  executor.run(taskflow).wait();

  return 0;
}